

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_symbol.hpp
# Opt level: O0

bool __thiscall
viennamath::rt_function_symbol<viennamath::rt_expression_interface<double>_>::deep_equal
          (rt_function_symbol<viennamath::rt_expression_interface<double>_> *this,
          rt_expression_interface<double> *other)

{
  id_type iVar1;
  bool local_41;
  rt_function_symbol<viennamath::rt_expression_interface<double>_> *local_40;
  self_type *ptr;
  rt_expression_interface<double> *other_local;
  rt_function_symbol<viennamath::rt_expression_interface<double>_> *this_local;
  
  if (other == (rt_expression_interface<double> *)0x0) {
    local_40 = (rt_function_symbol<viennamath::rt_expression_interface<double>_> *)0x0;
  }
  else {
    local_40 = (rt_function_symbol<viennamath::rt_expression_interface<double>_> *)
               __dynamic_cast(other,&rt_expression_interface<double>::typeinfo,
                              &rt_function_symbol<viennamath::rt_expression_interface<double>>::
                               typeinfo,0);
  }
  if (local_40 == (rt_function_symbol<viennamath::rt_expression_interface<double>_> *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    iVar1 = id(local_40);
    local_41 = false;
    if (iVar1 == this->id_) {
      local_41 = local_40->tag_id_ == this->tag_id_;
    }
    this_local._7_1_ = local_41;
  }
  return this_local._7_1_;
}

Assistant:

bool deep_equal(const InterfaceType * other) const
      {
        const self_type * ptr = dynamic_cast< const self_type *>(other);
        if (ptr != NULL)
          return (ptr->id() == id_ && ptr->tag_id_ == tag_id_);

        return false;
      }